

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STObject.h
# Opt level: O0

void __thiscall
jbcoin::STObject::Proxy<jbcoin::STInteger<unsigned_int>>::assign<unsigned_int&>
          (Proxy<jbcoin::STInteger<unsigned_int>> *this,uint *u)

{
  STBase *pSVar1;
  STInteger<unsigned_int> *local_48;
  STInteger<unsigned_int> *local_38;
  STInteger<unsigned_int> *local_20;
  STInteger<unsigned_int> *t;
  uint *u_local;
  Proxy<jbcoin::STInteger<unsigned_int>_> *this_local;
  
  if ((*(int *)(this + 8) == 2) && (*u == 0)) {
    makeFieldAbsent(*(STObject **)this,*(SField **)(this + 0x10));
  }
  else {
    if (*(int *)(this + 8) == -1) {
      pSVar1 = getPField(*(STObject **)this,*(SField **)(this + 0x10),true);
      if (pSVar1 == (STBase *)0x0) {
        local_38 = (STInteger<unsigned_int> *)0x0;
      }
      else {
        local_38 = (STInteger<unsigned_int> *)
                   __dynamic_cast(pSVar1,&STBase::typeinfo,&STInteger<unsigned_int>::typeinfo,0);
      }
      local_20 = local_38;
    }
    else {
      pSVar1 = makeFieldPresent(*(STObject **)this,*(SField **)(this + 0x10));
      if (pSVar1 == (STBase *)0x0) {
        local_48 = (STInteger<unsigned_int> *)0x0;
      }
      else {
        local_48 = (STInteger<unsigned_int> *)
                   __dynamic_cast(pSVar1,&STBase::typeinfo,&STInteger<unsigned_int>::typeinfo,0);
      }
      local_20 = local_48;
    }
    if (local_20 == (STInteger<unsigned_int> *)0x0) {
      __assert_fail("t",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/trongnmchainos[P]validator-keys-tool/extras/jbcoin-libpp/extras/jbcoind/src/jbcoin/protocol/STObject.h"
                    ,0x2dc,
                    "void jbcoin::STObject::Proxy<jbcoin::STInteger<unsigned int>>::assign(U &&) [T = jbcoin::STInteger<unsigned int>, U = unsigned int &]"
                   );
    }
    STInteger<unsigned_int>::operator=(local_20,u);
  }
  return;
}

Assistant:

void
STObject::Proxy<T>::assign(U&& u)
{
    if (style_ == SOE_DEFAULT &&
        u == value_type{})
    {
        st_->makeFieldAbsent(*f_);
        return;
    }
    T* t;
    if (style_ == SOE_INVALID)
        t = dynamic_cast<T*>(
            st_->getPField(*f_, true));
    else
        t = dynamic_cast<T*>(
            st_->makeFieldPresent(*f_));
    assert(t);
    *t = std::forward<U>(u);
}